

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying::IfcStructuralCurveMemberVarying
          (IfcStructuralCurveMemberVarying *this)

{
  IfcStructuralCurveMemberVarying *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcStructuralCurveMember).field_0x160,
             "IfcStructuralCurveMemberVarying");
  IfcStructuralCurveMember::IfcStructuralCurveMember
            (&this->super_IfcStructuralCurveMember,&PTR_construction_vtable_24__00fa41d8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying,_0UL> *)
             &(this->super_IfcStructuralCurveMember).field_0x150,
             &PTR_construction_vtable_24__00fa4360);
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0xfa4080;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x160 = 0xfa41c0;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xfa40a8;
  (this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xfa40d0;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xfa40f8;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0xfa4120;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0xfa4148;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0xfa4170;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x150 = 0xfa4198;
  return;
}

Assistant:

IfcStructuralCurveMemberVarying() : Object("IfcStructuralCurveMemberVarying") {}